

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

const_iterator __thiscall
VulkanHppGenerator::findAlias
          (VulkanHppGenerator *this,string *name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
          *aliases)

{
  _Alloc_hider _Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
  local_78;
  
  p_Var5 = &(aliases->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var3 = (aliases->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var5;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
              (&local_78,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                *)(p_Var3 + 1));
    _Var1._M_p = local_78.second.name._M_dataplus._M_p;
    if (name->_M_string_length == local_78.second.name._M_string_length) {
      if (local_78.second.name._M_string_length == 0) {
        bVar6 = true;
      }
      else {
        iVar2 = bcmp(local_78.second.name._M_dataplus._M_p,(name->_M_dataplus)._M_p,
                     local_78.second.name._M_string_length);
        bVar6 = iVar2 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var1._M_p != &local_78.second.name.field_2) {
      operator_delete(_Var1._M_p,local_78.second.name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
      operator_delete(local_78.first._M_dataplus._M_p,
                      local_78.first.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) break;
  }
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    for (p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        (_Rb_tree_header *)p_Var4 != p_Var5;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine,_true>
                (&local_78,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>
                  *)(p_Var4 + 1));
      _Var1._M_p = local_78.second.name._M_dataplus._M_p;
      if (name->_M_string_length == local_78.second.name._M_string_length) {
        if (local_78.second.name._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp(local_78.second.name._M_dataplus._M_p,(name->_M_dataplus)._M_p,
                       local_78.second.name._M_string_length);
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_78.second.name.field_2) {
        operator_delete(_Var1._M_p,local_78.second.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
        operator_delete(local_78.first._M_dataplus._M_p,
                        local_78.first.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        if ((_Rb_tree_header *)p_Var4 == p_Var5) {
          return (const_iterator)p_Var3;
        }
        __assert_fail("( it == aliases.end() ) || std::none_of( std::next( it ), aliases.end(), lambda )"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x81a,
                      "std::map<std::string, VulkanHppGenerator::NameLine>::const_iterator VulkanHppGenerator::findAlias(const std::string &, const std::map<std::string, NameLine> &) const"
                     );
      }
    }
  }
  return (const_iterator)p_Var3;
}

Assistant:

std::map<std::string, VulkanHppGenerator::NameLine>::const_iterator VulkanHppGenerator::findAlias( std::string const &                     name,
                                                                                                   std::map<std::string, NameLine> const & aliases ) const
{
  auto lambda = [&name]( std::pair<std::string, NameLine> const & ad ) { return ad.second.name == name; };
  auto it     = std::ranges::find_if( aliases, lambda );
  assert( ( it == aliases.end() ) || std::none_of( std::next( it ), aliases.end(), lambda ) );
  return it;
}